

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O2

void __thiscall QFileSystemTreeView::QFileSystemTreeView(QFileSystemTreeView *this,QWidget *parent)

{
  bool bVar1;
  int iVar2;
  QFileSystemTreeViewPrivate *this_00;
  QArrayDataPointer<char16_t> local_30;
  
  QTreeView::QTreeView(&this->super_QTreeView,parent);
  *(undefined ***)this = &PTR_metaObject_001c9fb0;
  *(undefined ***)&this->field_0x10 = &PTR__QFileSystemTreeView_001ca2d0;
  this_00 = (QFileSystemTreeViewPrivate *)operator_new(0x20);
  QFileSystemTreeViewPrivate::QFileSystemTreeViewPrivate(this_00,this);
  this->d = this_00;
  QTreeView::setUniformRowHeights(SUB81(this,0));
  QTreeView::setModel((QAbstractItemModel *)this);
  QDir::homePath();
  setRootPath(this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  bVar1 = (bool)QTreeView::header();
  QHeaderView::setStretchLastSection(bVar1);
  iVar2 = QTreeView::header();
  QHeaderView::setSectionResizeMode(iVar2,Interactive);
  return;
}

Assistant:

QFileSystemTreeView::QFileSystemTreeView(QWidget *parent)
    : QTreeView(parent)
    , d(new QFileSystemTreeViewPrivate(this)) {
    setUniformRowHeights(true);
    QTreeView::setModel(d->model);
    setRootPath(QDir::homePath());
    header()->setStretchLastSection(false);
    header()->setSectionResizeMode(static_cast<int>(QFileSystemTreeView::Column::Name), QHeaderView::Stretch);
}